

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *outpubkey,
                      ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  size_t __size;
  ptls_key_exchange_context_t *ppVar1;
  int iVar2;
  uint8_t *__dest;
  ptls_key_exchange_context_t *ctx;
  ptls_key_exchange_context_t *local_38;
  
  local_38 = (ptls_key_exchange_context_t *)0x0;
  outpubkey->base = (uint8_t *)0x0;
  iVar2 = evp_keyex_create(algo,&local_38);
  ppVar1 = local_38;
  if (iVar2 == 0) {
    __size = (local_38->pubkey).len;
    __dest = (uint8_t *)malloc(__size);
    outpubkey->base = __dest;
    if (__dest == (uint8_t *)0x0) {
      iVar2 = 0x201;
    }
    else {
      memcpy(__dest,(ppVar1->pubkey).base,__size);
      outpubkey->len = (ppVar1->pubkey).len;
      iVar2 = evp_keyex_on_exchange(&local_38,1,secret,peerkey);
      if (local_38 != (ptls_key_exchange_context_t *)0x0) {
        __assert_fail("ctx == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                      ,0x295,
                      "int evp_keyex_exchange(ptls_key_exchange_algorithm_t *, ptls_iovec_t *, ptls_iovec_t *, ptls_iovec_t)"
                     );
      }
    }
  }
  if (local_38 != (ptls_key_exchange_context_t *)0x0) {
    evp_keyex_on_exchange(&local_38,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
  }
  if (iVar2 != 0) {
    free(outpubkey->base);
  }
  return iVar2;
}

Assistant:

static int evp_keyex_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *outpubkey, ptls_iovec_t *secret,
                              ptls_iovec_t peerkey)
{
    ptls_key_exchange_context_t *ctx = NULL;
    int ret;

    outpubkey->base = NULL;

    if ((ret = evp_keyex_create(algo, &ctx)) != 0)
        goto Exit;
    if ((outpubkey->base = malloc(ctx->pubkey.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(outpubkey->base, ctx->pubkey.base, ctx->pubkey.len);
    outpubkey->len = ctx->pubkey.len;
    ret = evp_keyex_on_exchange(&ctx, 1, secret, peerkey);
    assert(ctx == NULL);

Exit:
    if (ctx != NULL)
        evp_keyex_on_exchange(&ctx, 1, NULL, ptls_iovec_init(NULL, 0));
    if (ret != 0)
        free(outpubkey->base);
    return ret;
}